

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

OrderCancelRequest * __thiscall
Application::queryOrderCancelRequest40(OrderCancelRequest *__return_storage_ptr__,Application *this)

{
  Header *header;
  OrderQty local_248;
  Side local_1f0;
  Symbol local_198;
  CHAR local_139;
  CxlType local_138;
  ClOrdID local_d0;
  OrigClOrdID local_78;
  undefined1 local_19;
  Application *local_18;
  Application *this_local;
  OrderCancelRequest *orderCancelRequest;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Application *)__return_storage_ptr__;
  queryOrigClOrdID(&local_78,this);
  queryClOrdID(&local_d0,this);
  local_139 = 'F';
  FIX::CxlType::CxlType(&local_138,&local_139);
  querySymbol(&local_198,this);
  querySide(&local_1f0,this);
  queryOrderQty(&local_248,this);
  FIX40::OrderCancelRequest::OrderCancelRequest
            (__return_storage_ptr__,&local_78,&local_d0,&local_138,&local_198,&local_1f0,&local_248)
  ;
  FIX::OrderQty::~OrderQty(&local_248);
  FIX::Side::~Side(&local_1f0);
  FIX::Symbol::~Symbol(&local_198);
  FIX::CxlType::~CxlType(&local_138);
  FIX::ClOrdID::~ClOrdID(&local_d0);
  FIX::OrigClOrdID::~OrigClOrdID(&local_78);
  header = FIX40::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  return __return_storage_ptr__;
}

Assistant:

FIX40::OrderCancelRequest Application::queryOrderCancelRequest40() {
  FIX40::OrderCancelRequest orderCancelRequest(
      queryOrigClOrdID(),
      queryClOrdID(),
      FIX::CxlType('F'),
      querySymbol(),
      querySide(),
      queryOrderQty());

  queryHeader(orderCancelRequest.getHeader());
  return orderCancelRequest;
}